

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall sf::Window::display(Window *this)

{
  bool bVar1;
  Time right;
  Time TVar2;
  
  bVar1 = setActive(this,true);
  if (bVar1) {
    (*this->m_context->_vptr_GlContext[2])();
  }
  bVar1 = operator!=((Time)(this->m_frameTimeLimit).m_microseconds,(Time)0x0);
  if (bVar1) {
    TVar2.m_microseconds = (this->m_frameTimeLimit).m_microseconds;
    right = Clock::getElapsedTime(&this->m_clock);
    TVar2 = operator-(TVar2,right);
    sleep((uint)TVar2.m_microseconds);
    Clock::restart(&this->m_clock);
    return;
  }
  return;
}

Assistant:

void Window::display()
{
    // Display the backbuffer on screen
    if (setActive())
        m_context->display();

    // Limit the framerate if needed
    if (m_frameTimeLimit != Time::Zero)
    {
        sleep(m_frameTimeLimit - m_clock.getElapsedTime());
        m_clock.restart();
    }
}